

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-danger.c
# Opt level: O3

wchar_t borg_danger(wchar_t y,wchar_t x,wchar_t c,_Bool average,_Bool full_damage)

{
  chunk_conflict *c_00;
  _Bool _Var1;
  int16_t iVar2;
  loc lVar3;
  borg_kill *pbVar4;
  long lVar5;
  wchar_t wVar6;
  long lVar7;
  wchar_t wVar8;
  
  lVar3 = (loc)loc(x,y);
  _Var1 = square_in_bounds(cave,lVar3);
  if (_Var1) {
    _Var1 = square_isvault(cave,lVar3);
    c_00 = cave;
    wVar6 = L'\0';
    if (borg.trait[0x69] < 0x51 && !_Var1) {
      wVar6 = (uint)borg_fear_region[y / 0xb][x / 0xb] * c;
    }
    wVar8 = L'Ĭ';
    if (wVar6 < L'Ĭ') {
      wVar8 = wVar6;
    }
    if (borg.trait[0x69] != 100) {
      wVar8 = wVar6;
    }
    if (borg.time_this_panel < 0xc9) {
      lVar3 = (loc)loc(x,y);
      _Var1 = square_isvault(c_00,lVar3);
      if (!_Var1) {
        wVar8 = wVar8 + (uint)borg_fear_monsters[y][x] * c;
      }
    }
    if (1 < borg_kills_nxt) {
      lVar7 = 1;
      lVar5 = 0x1d8;
      pbVar4 = borg_kills;
      iVar2 = borg_kills_nxt;
      do {
        if (*(short *)(pbVar4->spell + lVar5 + -0x19) != 0) {
          wVar6 = borg_danger_one_kill(y,x,c,(wchar_t)lVar7,average,true);
          wVar8 = wVar8 + wVar6;
          pbVar4 = borg_kills;
          iVar2 = borg_kills_nxt;
        }
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + 0x1d8;
      } while (lVar7 < iVar2);
    }
    wVar6 = L'ߐ';
    if (wVar8 < L'ߐ') {
      wVar6 = wVar8;
    }
  }
  else {
    wVar6 = L'ߐ';
  }
  return wVar6;
}

Assistant:

int borg_danger(int y, int x, int c, bool average, bool full_damage)
{
    int i, p = 0;

    struct loc l = loc(x, y);
    if (!square_in_bounds(cave, l))
        return 2000;

    /* Base danger (from regional fear) but not within a vault.  Cheating the
     * floor grid */
    if (!square_isvault(cave, l) && borg.trait[BI_CDEPTH] <= 80) {
        p += borg_fear_region[y / 11][x / 11] * c;
    }

    /* Reduce regional fear on Depth 100 */
    if (borg.trait[BI_CDEPTH] == 100 && p >= 300)
        p = 300;

    /* Added danger (from a lot of monsters).
     * But do not add it if we have been sitting on
     * this panel for too long, or monster's in a vault.  The fear_monsters[][]
     * can induce some bouncy behavior.
     */
    if (borg.time_this_panel <= 200 && !square_isvault(cave, loc(x, y)))
        p += borg_fear_monsters[y][x] * c;

    full_damage = true;

    /* Examine all the monsters */
    for (i = 1; i < borg_kills_nxt; i++) {
        borg_kill *kill = &borg_kills[i];

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* Collect danger from monster */
        p += borg_danger_one_kill(y, x, c, i, average, full_damage);
    }

    /* Return the danger */
    return (p > 2000 ? 2000 : p);
}